

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MXFTypes.cpp
# Opt level: O0

char * __thiscall
ASDCP::MXF::J2KExtendedCapabilitiesType::EncodeString
          (J2KExtendedCapabilitiesType *this,char *str_buf,ui32_t buf_len)

{
  size_type sVar1;
  const_reference pvVar2;
  ulong local_28;
  size_t i;
  int str_len;
  ui32_t buf_len_local;
  char *str_buf_local;
  J2KExtendedCapabilitiesType *this_local;
  
  if ((this->Pcap == 0) || (buf_len < 0x61)) {
    *str_buf = '\0';
  }
  else {
    local_28 = 0;
    while( true ) {
      sVar1 = std::vector<Kumu::ArchivableUi16,_std::allocator<Kumu::ArchivableUi16>_>::size
                        (&(this->Ccap).
                          super_FixedSizeItemCollection<std::vector<Kumu::ArchivableUi16,_std::allocator<Kumu::ArchivableUi16>_>_>
                          .super_vector<Kumu::ArchivableUi16,_std::allocator<Kumu::ArchivableUi16>_>
                        );
      if (sVar1 <= local_28) break;
      pvVar2 = std::vector<Kumu::ArchivableUi16,_std::allocator<Kumu::ArchivableUi16>_>::operator[]
                         (&(this->Ccap).
                           super_FixedSizeItemCollection<std::vector<Kumu::ArchivableUi16,_std::allocator<Kumu::ArchivableUi16>_>_>
                           .
                           super_vector<Kumu::ArchivableUi16,_std::allocator<Kumu::ArchivableUi16>_>
                          ,local_28);
      snprintf(str_buf + local_28 * 3,4,"%02hx.",(ulong)pvVar2->value);
      local_28 = local_28 + 1;
    }
    str_buf[0x5f] = '\0';
  }
  return str_buf;
}

Assistant:

const char*
ASDCP::MXF::J2KExtendedCapabilitiesType::EncodeString(char* str_buf, ui32_t buf_len) const
{
  const int str_len = ( sizeof(ui16_t) + 1 ) * JP2K::MaxCapabilities;

  if ( Pcap != 0 && buf_len > str_len )
    {
      for ( size_t i = 0; i < Ccap.size(); ++i )
        {
	  snprintf(str_buf+(i*3), 4, "%02hx.", Ccap[i].value);
        }

      str_buf[str_len-1] = 0;
    }
  else
    {
      str_buf[0] = 0;
    }

  return str_buf;
}